

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

ControlBlock * __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>_>
::start_consume_impl
          (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>_>
           *this)

{
  ControlBlock *tail;
  ControlBlock *curr;
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(float,_double)>,_density::basic_default_allocator<65536UL>_>
  *this_local;
  
  tail = this->m_head;
  while( true ) {
    if (tail == this->m_tail) {
      return (ControlBlock *)0x0;
    }
    if ((tail->m_next & 3) == 0) break;
    tail = (ControlBlock *)(tail->m_next & 0xfffffffffffffff8);
  }
  tail->m_next = tail->m_next + 1;
  return tail;
}

Assistant:

ControlBlock * start_consume_impl() noexcept
        {
            auto       curr = m_head;
            auto const tail = m_tail;
            while (curr != tail)
            {
                if ((curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == 0)
                {
                    curr->m_next += detail::Queue_Busy;
                    return curr;
                }

                curr = reinterpret_cast<ControlBlock *>(curr->m_next & ~detail::Queue_AllFlags);
            }

            return nullptr;
        }